

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O3

void read_agency(agency_t *record,int field_count,char **field_names,char **field_values)

{
  char *__s1;
  int iVar1;
  agency_t *__dest;
  ulong uVar2;
  
  record->id[0] = '\0';
  record->name[0] = '\0';
  record->url[0] = '\0';
  record->timezone[0] = '\0';
  record->lang[0] = '\0';
  record->phone[0] = '\0';
  record->fare_url[0] = '\0';
  record->email[0] = '\0';
  if (0 < field_count) {
    uVar2 = 0;
    do {
      __s1 = field_names[uVar2];
      iVar1 = strcmp(__s1,"agency_id");
      __dest = record;
      if (((((iVar1 == 0) ||
            (iVar1 = strcmp(__s1,"agency_name"), __dest = (agency_t *)record->name, iVar1 == 0)) ||
           (iVar1 = strcmp(__s1,"agency_url"), __dest = (agency_t *)record->url, iVar1 == 0)) ||
          ((iVar1 = strcmp(__s1,"agency_timezone"), __dest = (agency_t *)record->timezone,
           iVar1 == 0 ||
           (iVar1 = strcmp(__s1,"agency_lang"), __dest = (agency_t *)record->lang, iVar1 == 0)))) ||
         ((iVar1 = strcmp(__s1,"agency_phone"), __dest = (agency_t *)record->phone, iVar1 == 0 ||
          ((iVar1 = strcmp(__s1,"agency_fare_url"), __dest = (agency_t *)record->fare_url,
           iVar1 == 0 ||
           (iVar1 = strcmp(__s1,"agency_email"), __dest = (agency_t *)record->email, iVar1 == 0)))))
         ) {
        strcpy(__dest->id,field_values[uVar2]);
      }
      uVar2 = uVar2 + 1;
    } while ((uint)field_count != uVar2);
  }
  return;
}

Assistant:

void read_agency(agency_t *record, int field_count, const char **field_names, const char **field_values) {
    init_agency(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "agency_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_name") == 0) {
            strcpy(record->name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_url") == 0) {
            strcpy(record->url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_timezone") == 0) {
            strcpy(record->timezone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_lang") == 0) {
            strcpy(record->lang, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_phone") == 0) {
            strcpy(record->phone, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_fare_url") == 0) {
            strcpy(record->fare_url, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "agency_email") == 0) {
            strcpy(record->email, field_values[i]);
            continue;
        }
    }
}